

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::TableCreateSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,StructDef *struct_def,bool predecl,
          IDLOptions *opts)

{
  char *__rhs;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IDLOptions *local_30;
  IDLOptions *opts_local;
  StructDef *pSStack_20;
  bool predecl_local;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_30 = opts;
  opts_local._7_1_ = predecl;
  pSStack_20 = struct_def;
  struct_def_local = (StructDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  Name_abi_cxx11_(&local_170,this,&struct_def->super_Definition);
  std::operator+(&local_150,"::flatbuffers::Offset<",&local_170);
  std::operator+(&local_130,&local_150,"> Create");
  Name_abi_cxx11_(&local_1a0,this,&pSStack_20->super_Definition);
  std::operator+(&local_110,&local_130,&local_1a0);
  std::operator+(&local_f0,&local_110,"(");
  GetBuilder_abi_cxx11_(&local_1c0,this);
  std::operator+(&local_d0,&local_f0,&local_1c0);
  std::operator+(&local_b0,&local_d0," &_fbb, const ");
  Name_abi_cxx11_(&local_200,this,&pSStack_20->super_Definition);
  NativeName(&local_1e0,&local_200,pSStack_20,local_30);
  std::operator+(&local_90,&local_b0,&local_1e0);
  std::operator+(&local_70,&local_90," *_o, const ::flatbuffers::rehasher_function_t *_rehasher");
  __rhs = "";
  if ((opts_local._7_1_ & 1) != 0) {
    __rhs = " = nullptr";
  }
  std::operator+(&local_50,&local_70,__rhs);
  std::operator+(__return_storage_ptr__,&local_50,")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  return __return_storage_ptr__;
}

Assistant:

std::string TableCreateSignature(const StructDef &struct_def, bool predecl,
                                   const IDLOptions &opts) {
    return "::flatbuffers::Offset<" + Name(struct_def) + "> Create" +
           Name(struct_def) + "(" + GetBuilder() + " &_fbb, const " +
           NativeName(Name(struct_def), &struct_def, opts) +
           " *_o, const ::flatbuffers::rehasher_function_t *_rehasher" +
           (predecl ? " = nullptr" : "") + ")";
  }